

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

ApplicationInfoFilter *
Fossilize::ApplicationInfoFilter::parse
          (char *path,_func_char_ptr_char_ptr_void_ptr *getenv_wrapper,void *userdata)

{
  bool bVar1;
  ApplicationInfoFilter *filter;
  void *userdata_local;
  _func_char_ptr_char_ptr_void_ptr *getenv_wrapper_local;
  char *path_local;
  
  path_local = (char *)operator_new(8);
  ApplicationInfoFilter((ApplicationInfoFilter *)path_local);
  ((ApplicationInfoFilter *)path_local)->impl->getenv_wrapper = getenv_wrapper;
  ((ApplicationInfoFilter *)path_local)->impl->getenv_userdata = userdata;
  bVar1 = Impl::parse(((ApplicationInfoFilter *)path_local)->impl,path);
  if (!bVar1) {
    if ((ApplicationInfoFilter *)path_local != (ApplicationInfoFilter *)0x0) {
      ~ApplicationInfoFilter((ApplicationInfoFilter *)path_local);
      operator_delete(path_local,8);
    }
    path_local = (char *)0x0;
  }
  return (ApplicationInfoFilter *)path_local;
}

Assistant:

ApplicationInfoFilter *ApplicationInfoFilter::parse(
		const char *path,
		const char *(*getenv_wrapper)(const char *, void *),
		void *userdata)
{
	auto *filter = new ApplicationInfoFilter;

	filter->impl->getenv_wrapper = getenv_wrapper;
	filter->impl->getenv_userdata = userdata;

	if (!filter->impl->parse(path))
	{
		delete filter;
		return nullptr;
	}

	return filter;
}